

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

EventLoop * kj::anon_unknown_173::currentEventLoop(void)

{
  bool bVar1;
  long *in_FS_OFFSET;
  Fault local_50;
  Fault f;
  EventLoop **local_40;
  undefined1 local_38 [8];
  DebugComparison<kj::EventLoop_*&,_std::nullptr_t> _kjCondition;
  EventLoop *loop;
  
  _kjCondition._32_8_ = *(undefined8 *)(*in_FS_OFFSET + -0x28);
  local_40 = (EventLoop **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (EventLoop **)&_kjCondition.result);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<kj::EventLoop*&>::operator!=
            ((DebugComparison<kj::EventLoop_*&,_std::nullptr_t> *)local_38,
             (DebugExpression<kj::EventLoop*&> *)&local_40,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::EventLoop*&,decltype(nullptr)>&,char_const(&)[41]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0xae,FAILED,"loop != nullptr",
               "_kjCondition,\"No event loop is running on this thread.\"",
               (DebugComparison<kj::EventLoop_*&,_std::nullptr_t> *)local_38,
               (char (*) [41])"No event loop is running on this thread.");
    kj::_::Debug::Fault::fatal(&local_50);
  }
  return (EventLoop *)_kjCondition._32_8_;
}

Assistant:

EventLoop& currentEventLoop() {
  EventLoop* loop = threadLocalEventLoop;
  KJ_REQUIRE(loop != nullptr, "No event loop is running on this thread.");
  return *loop;
}